

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TypeValidator::validateSingleVariable
          (TypeValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  DataType DVar1;
  DataType DVar2;
  const_reference this_00;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  allocator<char> local_379;
  string local_378;
  char *local_358;
  MessageBuilder local_350;
  char *local_1d0 [3];
  MessageBuilder local_1b8;
  VarType *local_38;
  VarType *variable;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  TypeValidator *this_local;
  
  variable = (VarType *)implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  this_00 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
            ::back(path);
  local_38 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(this_00);
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [27])"Verifying type, expecting ");
  DVar1 = glu::VarType::getBasicType(local_38);
  local_1d0[0] = glu::getDataTypeName(DVar1);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1d0);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  DVar1 = glu::VarType::getBasicType(local_38);
  DVar2 = glu::getDataTypeFromGLType(implementationName_local._4_4_);
  if (DVar1 != DVar2) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_350,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_350,(char (*) [13])"\tError, got ");
    DVar1 = glu::getDataTypeFromGLType(implementationName_local._4_4_);
    local_358 = glu::getDataTypeName(DVar1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_358);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_350);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_378,"resource type invalid",&local_379);
    PropValidator::setError((PropValidator *)this,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator(&local_379);
  }
  return;
}

Assistant:

void TypeValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const glu::VarType* variable = path.back().getVariableType();

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying type, expecting " << glu::getDataTypeName(variable->getBasicType()) << tcu::TestLog::EndMessage;

	if (variable->getBasicType() != glu::getDataTypeFromGLType(propValue))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << glu::getDataTypeName(glu::getDataTypeFromGLType(propValue)) << tcu::TestLog::EndMessage;
		setError("resource type invalid");
	}
}